

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O2

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingFullyOpaquePixelIsCopied
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  allocator local_be;
  uint8_t cover;
  pixel4 dest4;
  string local_b8;
  pixel4 reference4;
  pixel3 reference3;
  pixel2 reference2;
  pixel1 reference1;
  pixel3 dest3;
  pixel2 dest2;
  pixel1 dest1;
  LocationInfo local_78;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra> b2;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b1;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr> b4;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb> b3;
  
  cover = 0xff;
  cVar1 = color::make('\x10',' ','0',0xff);
  b1._color._0_2_ = cVar1._0_2_;
  b1._color.b = cVar1.b;
  b1._color.a = cVar1.a;
  b1._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  cVar1 = color::make('\x10',' ','0',0xff);
  b2._color._0_2_ = cVar1._0_2_;
  b2._color.b = cVar1.b;
  b2._color.a = cVar1.a;
  b2._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  cVar1 = color::make('\x10',' ','0',0xff);
  b3._color._0_2_ = cVar1._0_2_;
  b3._color.b = cVar1.b;
  b3._color.a = cVar1.a;
  b3._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  cVar1 = color::make('\x10',' ','0',0xff);
  b4._color._0_2_ = cVar1._0_2_;
  b4._color.b = cVar1.b;
  b4._color.a = cVar1.a;
  b4._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  dest1.components[0] = '\0';
  dest1.components[1] = '\0';
  dest1.components[2] = '\0';
  dest1.components[3] = '\0';
  dest2.components[0] = '\0';
  dest2.components[1] = '\0';
  dest2.components[2] = '\0';
  dest2.components[3] = '\0';
  dest3.components[0] = '\0';
  dest3.components[1] = '\0';
  dest3.components[2] = '\0';
  dest3.components[3] = '\0';
  dest4.components[0] = '\0';
  dest4.components[1] = '\0';
  dest4.components[2] = '\0';
  dest4.components[3] = '\0';
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&b1,&dest1,0,0,1,&cover);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>::
  operator()(&b2,&dest2,0,0,1,&cover);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>::
  operator()(&b3,&dest3,0,0,1,&cover);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr>::
  operator()(&b4,&dest4,0,0,1,&cover);
  builtin_memcpy(reference1.components,"\x10 0",4);
  builtin_memcpy(reference2.components,"0 \x10",4);
  reference3.components[0] = '\0';
  reference3.components[1] = '\x10';
  reference3.components[2] = ' ';
  reference3.components[3] = '0';
  reference4.components[0] = '\0';
  reference4.components[1] = '0';
  reference4.components[2] = ' ';
  reference4.components[3] = '\x10';
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_be);
  ut::LocationInfo::LocationInfo(&local_78,&local_b8,0x85);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            (&reference1,&dest1,&local_78);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_be);
  ut::LocationInfo::LocationInfo(&local_78,&local_b8,0x86);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,agge::tests::mocks::pixel_rgbx<agge::order_bgra>>
            (&reference2,&dest2,&local_78);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_be);
  ut::LocationInfo::LocationInfo(&local_78,&local_b8,0x87);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_argb>,agge::tests::mocks::pixel_rgbx<agge::order_argb>>
            (&reference3,&dest3,&local_78);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_be);
  ut::LocationInfo::LocationInfo(&local_78,&local_b8,0x88);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,agge::tests::mocks::pixel_rgbx<agge::order_abgr>>
            (&reference4,&dest4,&local_78);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( BlendingFullyOpaquePixelIsCopied )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel1;
				typedef mocks::pixel_rgbx<order_bgra> pixel2;
				typedef mocks::pixel_rgbx<order_argb> pixel3;
				typedef mocks::pixel_rgbx<order_abgr> pixel4;

				// INIT
				const uint8_t cover = 0xFF;
				blender_solid_color_rgb<pixel1, order_rgba> b1(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel2, order_bgra> b2(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel3, order_argb> b3(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel4, order_abgr> b4(color::make(0x10, 0x20, 0x30));
				pixel1 dest1 = { };
				pixel2 dest2 = { };
				pixel3 dest3 = { };
				pixel4 dest4 = { };

				// ACT
				b1(&dest1, 0, 0, 1, &cover);
				b2(&dest2, 0, 0, 1, &cover);
				b3(&dest3, 0, 0, 1, &cover);
				b4(&dest4, 0, 0, 1, &cover);

				// ASSERT
				pixel1 reference1 = { { 0x10, 0x20, 0x30 } };
				pixel2 reference2 = { { 0x30, 0x20, 0x10 } };
				pixel3 reference3 = { { 0, 0x10, 0x20, 0x30 } };
				pixel4 reference4 = { { 0, 0x30, 0x20, 0x10 } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
				assert_equal(reference3, dest3);
				assert_equal(reference4, dest4);
			}